

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

bool vkt::memory::anon_unknown_0::layoutSupportedByUsage(Usage usage,VkImageLayout layout)

{
  byte bVar1;
  
  switch(layout) {
  case VK_IMAGE_LAYOUT_GENERAL:
  case VK_IMAGE_LAYOUT_PREINITIALIZED:
    return true;
  case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
    bVar1 = (byte)(usage >> 0xd);
    break;
  case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
  case VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL:
    return SUB41((usage & (USAGE_DEPTH_STENCIL_ATTACHMENT|USAGE_INPUT_ATTACHMENT|
                           USAGE_COLOR_ATTACHMENT|USAGE_STORAGE_IMAGE|USAGE_SAMPLED_IMAGE|
                           USAGE_INDIRECT_BUFFER|USAGE_STORAGE_TEXEL_BUFFER|
                           USAGE_UNIFORM_TEXEL_BUFFER|USAGE_STORAGE_BUFFER|USAGE_UNIFORM_BUFFER|
                           USAGE_VERTEX_BUFFER|USAGE_INDEX_BUFFER|USAGE_TRANSFER_DST|
                           USAGE_TRANSFER_SRC|USAGE_HOST_WRITE|USAGE_HOST_READ)) >> 0xf,0);
  case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
    bVar1 = (byte)(usage >> 0xb);
    break;
  case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
    return SUB41((usage & USAGE_TRANSFER_SRC) >> 2,0);
  case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
    return SUB41((usage & USAGE_TRANSFER_DST) >> 3,0);
  default:
    return false;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool layoutSupportedByUsage (Usage usage, vk::VkImageLayout layout)
{
	switch (layout)
	{
		case vk::VK_IMAGE_LAYOUT_GENERAL:
			return true;

		case vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
			return (usage & USAGE_COLOR_ATTACHMENT) != 0;

		case vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
			return (usage & USAGE_DEPTH_STENCIL_ATTACHMENT) != 0;

		case vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL:
			return (usage & USAGE_DEPTH_STENCIL_ATTACHMENT) != 0;

		case vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
			// \todo [2016-03-09 mika] Should include input attachment
			return (usage & USAGE_SAMPLED_IMAGE) != 0;

		case vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
			return (usage & USAGE_TRANSFER_SRC) != 0;

		case vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
			return (usage & USAGE_TRANSFER_DST) != 0;

		case vk::VK_IMAGE_LAYOUT_PREINITIALIZED:
			return true;

		default:
			DE_FATAL("Unknown layout");
			return false;
	}
}